

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t canGrzip(void)

{
  wchar_t wVar1;
  
  if (canGrzip_tested == '\0') {
    canGrzip_tested = '\x01';
    wVar1 = systemf("grzip -V %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canGrzip_value = 1;
    }
  }
  return (uint)canGrzip_value;
}

Assistant:

int
canGrzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("grzip -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}